

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

bool __thiscall sf::priv::WindowImplX11::processEvent(WindowImplX11 *this,XEvent *windowEvent)

{
  byte bVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  Display *pDVar3;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Time TVar9;
  ostream *poVar10;
  long lVar11;
  Uint8 *begin;
  Atom AVar12;
  Event event;
  Uint8 keyBuffer [64];
  Uint32 unicode;
  Event textEvent;
  int status_1;
  
  switch(windowEvent->type) {
  case 2:
    event.type = KeyPressed;
    event.field_1.key.code = KeyboardImpl::getKeyFromEvent(&windowEvent->xkey);
    event.field_1.key.scancode = KeyboardImpl::getScancodeFromEvent(&windowEvent->xkey);
    bVar1 = (byte)(windowEvent->xkey).state;
    event.field_1.key.alt = (bool)(bVar1 >> 3 & 1);
    event.field_1.key.control = (bool)(bVar1 >> 2 & 1);
    event.field_1.key.shift = (bool)(bVar1 & 1);
    event.field_1.key.system = (bool)(bVar1 >> 6 & 1);
    iVar7 = XFilterEvent(windowEvent,0);
    if (iVar7 == 0) {
      bVar5 = std::bitset<256UL>::test
                        ((bitset<256UL> *)(anonymous_namespace)::WindowsImplX11Impl::isKeyFiltered,
                         (ulong)(windowEvent->xkey).keycode);
      if ((!bVar5) && ((windowEvent->xkey).keycode != 0)) {
        WindowImpl::pushEvent(&this->super_WindowImpl,&event);
      }
      if (this->m_inputContext == (XIC)0x0) {
        iVar7 = XLookupString(windowEvent,&textEvent,0x10,0,&processEvent::status);
        if (iVar7 != 0) {
          keyBuffer[0] = '\x04';
          keyBuffer[1] = '\0';
          keyBuffer[2] = '\0';
          keyBuffer[3] = '\0';
          keyBuffer._4_4_ = SEXT14((char)(undefined1)textEvent.type);
          goto LAB_001c4cfb;
        }
      }
      else {
        begin = keyBuffer;
        iVar7 = Xutf8LookupString(this->m_inputContext,windowEvent,begin,0x40,0,&status_1);
        if (status_1 == 2) {
          unicode = 0;
          while (begin < keyBuffer + iVar7) {
            begin = Utf<8u>::decode<unsigned_char*>(begin,keyBuffer + iVar7,&unicode,0);
            if (unicode != 0) {
              textEvent.type = TextEntered;
              textEvent.field_1.size.width = unicode;
              WindowImpl::pushEvent(&this->super_WindowImpl,&textEvent);
            }
          }
        }
        else if (status_1 == -1) {
          poVar10 = err();
          poVar10 = std::operator<<(poVar10,
                                    "A TextEntered event has more than 64 bytes of UTF-8 input, and has been discarded\nThis means either you have typed a very long string (more than 20 chars), or your input method is broken in obscure ways."
                                   );
          std::endl<char,std::char_traits<char>>(poVar10);
        }
      }
    }
    else {
      WindowImpl::pushEvent(&this->super_WindowImpl,&event);
      std::bitset<256UL>::set
                ((bitset<256UL> *)(anonymous_namespace)::WindowsImplX11Impl::isKeyFiltered,
                 (ulong)(windowEvent->xkey).keycode,true);
    }
    goto LAB_001c4d03;
  case 3:
    keyBuffer[0] = '\x06';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
    keyBuffer._4_4_ = KeyboardImpl::getKeyFromEvent(&windowEvent->xkey);
    keyBuffer._8_4_ = KeyboardImpl::getScancodeFromEvent(&windowEvent->xkey);
    bVar1 = (byte)(windowEvent->xkey).state;
    keyBuffer[0xc] = bVar1 >> 3 & 1;
    keyBuffer[0xd] = bVar1 >> 2 & 1;
    keyBuffer[0xe] = bVar1 & 1;
    keyBuffer[0xf] = bVar1 >> 6 & 1;
    goto LAB_001c4f86;
  case 4:
    uVar8 = (windowEvent->xkey).keycode;
    if ((uVar8 < 10) && ((0x30eU >> (uVar8 & 0x1f) & 1) != 0)) {
      keyBuffer[0] = '\t';
      keyBuffer[1] = '\0';
      keyBuffer[2] = '\0';
      keyBuffer[3] = '\0';
      AVar12 = (windowEvent->xselectionrequest).property;
      keyBuffer._8_4_ = (undefined4)AVar12;
      keyBuffer[0xc] = (Uint8)(AVar12 >> 0x20);
      keyBuffer[0xd] = (Uint8)(AVar12 >> 0x28);
      keyBuffer[0xe] = (Uint8)(AVar12 >> 0x30);
      keyBuffer[0xf] = (Uint8)(AVar12 >> 0x38);
      uVar8 = uVar8 - 1;
      if ((uVar8 < 9) && ((0x187U >> (uVar8 & 0x1f) & 1) != 0)) {
        keyBuffer._4_4_ = *(undefined4 *)(&DAT_00204abc + (ulong)uVar8 * 4);
      }
LAB_001c4cfb:
      WindowImpl::pushEvent(&this->super_WindowImpl,(Event *)keyBuffer);
    }
LAB_001c4d03:
    updateLastInputTime(this,(windowEvent->xkey).time);
    break;
  case 5:
    uVar8 = (windowEvent->xkey).keycode;
    if ((uVar8 < 10) && ((0x30eU >> (uVar8 & 0x1f) & 1) != 0)) {
      keyBuffer[0] = '\n';
      keyBuffer[1] = '\0';
      keyBuffer[2] = '\0';
      keyBuffer[3] = '\0';
      AVar12 = (windowEvent->xselectionrequest).property;
      keyBuffer._8_4_ = (undefined4)AVar12;
      keyBuffer[0xc] = (Uint8)(AVar12 >> 0x20);
      keyBuffer[0xd] = (Uint8)(AVar12 >> 0x28);
      keyBuffer[0xe] = (Uint8)(AVar12 >> 0x30);
      keyBuffer[0xf] = (Uint8)(AVar12 >> 0x38);
      uVar8 = uVar8 - 1;
      if ((uVar8 < 9) && ((0x187U >> (uVar8 & 0x1f) & 1) != 0)) {
        keyBuffer._4_4_ = *(undefined4 *)(&DAT_00204abc + (ulong)uVar8 * 4);
      }
    }
    else if ((uVar8 & 0xfffffffe) == 6) {
      keyBuffer._8_4_ = (undefined4)(int)((uint)(uVar8 == 6) * 2 + -1);
      keyBuffer[0] = '\b';
      keyBuffer[1] = '\0';
      keyBuffer[2] = '\0';
      keyBuffer[3] = '\0';
      keyBuffer[4] = '\x01';
      keyBuffer[5] = '\0';
      keyBuffer[6] = '\0';
      keyBuffer[7] = '\0';
      AVar12 = (windowEvent->xselectionrequest).property;
      keyBuffer[0xc] = (Uint8)AVar12;
      keyBuffer[0xd] = (Uint8)(AVar12 >> 8);
      keyBuffer[0xe] = (Uint8)(AVar12 >> 0x10);
      keyBuffer[0xf] = (Uint8)(AVar12 >> 0x18);
      keyBuffer._16_4_ = (undefined4)(AVar12 >> 0x20);
    }
    else {
      if ((uVar8 & 0xfffffffe) != 4) {
        return true;
      }
      keyBuffer[0] = '\a';
      keyBuffer[1] = '\0';
      keyBuffer[2] = '\0';
      keyBuffer[3] = '\0';
      iVar7 = (uint)(uVar8 == 4) * 2 + -1;
      AVar12 = (windowEvent->xselectionrequest).property;
      keyBuffer._8_4_ = (undefined4)AVar12;
      keyBuffer[0xc] = (Uint8)(AVar12 >> 0x20);
      keyBuffer[0xd] = (Uint8)(AVar12 >> 0x28);
      keyBuffer[0xe] = (Uint8)(AVar12 >> 0x30);
      keyBuffer[0xf] = (Uint8)(AVar12 >> 0x38);
      keyBuffer._4_4_ = iVar7;
      WindowImpl::pushEvent(&this->super_WindowImpl,(Event *)keyBuffer);
      keyBuffer._8_4_ = (undefined4)iVar7;
      keyBuffer[0] = '\b';
      keyBuffer[1] = '\0';
      keyBuffer[2] = '\0';
      keyBuffer[3] = '\0';
      keyBuffer[4] = '\0';
      keyBuffer[5] = '\0';
      keyBuffer[6] = '\0';
      keyBuffer[7] = '\0';
      AVar12 = (windowEvent->xselectionrequest).property;
      keyBuffer[0xc] = (Uint8)AVar12;
      keyBuffer[0xd] = (Uint8)(AVar12 >> 8);
      keyBuffer[0xe] = (Uint8)(AVar12 >> 0x10);
      keyBuffer[0xf] = (Uint8)(AVar12 >> 0x18);
      keyBuffer._16_4_ = (undefined4)(AVar12 >> 0x20);
    }
    goto LAB_001c4f86;
  case 6:
    keyBuffer[0] = '\v';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
    uVar2 = *(int *)((long)windowEvent + 0x40);
    uVar4 = *(int *)((long)windowEvent + 0x44);
    keyBuffer._4_4_ = uVar2;
    keyBuffer._8_4_ = uVar4;
    goto LAB_001c4f86;
  case 7:
    if ((windowEvent->xkey).state != 0) {
      return true;
    }
    keyBuffer[0] = '\f';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
    goto LAB_001c4f86;
  case 8:
    if ((windowEvent->xkey).state != 0) {
      return true;
    }
    keyBuffer[0] = '\r';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
    goto LAB_001c4f86;
  case 9:
    if (this->m_inputContext != (XIC)0x0) {
      XSetICFocus();
    }
    if (this->m_cursorGrabbed == true) {
      iVar7 = 5;
      while (bVar5 = iVar7 != 0, iVar7 = iVar7 + -1, bVar5) {
        iVar6 = XGrabPointer(this->m_display,this->m_window,1,0,1,1,this->m_window,0,0);
        if (iVar6 == 0) {
          this->m_cursorGrabbed = true;
          goto LAB_001c505d;
        }
        TVar9 = milliseconds(0x32);
        sleep((uint)TVar9.m_microseconds);
      }
      if ((this->m_cursorGrabbed & 1U) == 0) {
        poVar10 = err();
        poVar10 = std::operator<<(poVar10,"Failed to grab mouse cursor");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
    }
LAB_001c505d:
    keyBuffer[0] = '\x03';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
    WindowImpl::pushEvent(&this->super_WindowImpl,(Event *)keyBuffer);
    lVar11 = XGetWMHints(this->m_display,this->m_window);
    if (lVar11 != 0) {
      *(byte *)(lVar11 + 1) = *(byte *)(lVar11 + 1) & 0xfe;
      XSetWMHints(this->m_display,this->m_window,lVar11);
      XFree(lVar11);
    }
    break;
  case 10:
    if (this->m_inputContext != (XIC)0x0) {
      XUnsetICFocus();
    }
    if (this->m_cursorGrabbed == true) {
      XUngrabPointer(this->m_display,0);
    }
    keyBuffer[0] = '\x02';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
    goto LAB_001c4f86;
  case 0xf:
    if (((windowEvent->xany).window == this->m_window) && ((windowEvent->xfocus).mode != 2)) {
      this->m_windowMapped = true;
    }
    break;
  case 0x11:
    cleanup(this,(EVP_PKEY_CTX *)&windowEvent->xany);
    break;
  case 0x12:
    if ((windowEvent->xkey).root == this->m_window) {
      this->m_windowMapped = false;
    }
    break;
  case 0x16:
    keyBuffer._4_4_ = (windowEvent->xexpose).count;
    keyBuffer._8_4_ = (windowEvent->xgraphicsexpose).major_code;
    if ((keyBuffer._4_4_ != (this->m_previousSize).x) ||
       (keyBuffer._8_4_ != (this->m_previousSize).y)) {
      keyBuffer[0] = '\x01';
      keyBuffer[1] = '\0';
      keyBuffer[2] = '\0';
      keyBuffer[3] = '\0';
      WindowImpl::pushEvent(&this->super_WindowImpl,(Event *)keyBuffer);
      (this->m_previousSize).x = (windowEvent->xexpose).count;
      (this->m_previousSize).y = (windowEvent->xgraphicsexpose).major_code;
    }
    break;
  case 0x1c:
    if (this->m_lastInputTime == 0) {
      this->m_lastInputTime = (windowEvent->xkey).subwindow;
    }
    break;
  case 0x21:
    iVar7 = XFilterEvent(windowEvent,0);
    if (iVar7 != 0) {
      return true;
    }
    if ((processEvent(_XEvent&)::wmProtocols == '\0') &&
       (iVar7 = __cxa_guard_acquire(&processEvent(_XEvent&)::wmProtocols), iVar7 != 0)) {
      std::__cxx11::string::string((string *)keyBuffer,"WM_PROTOCOLS",(allocator *)&event);
      AVar12 = getAtom((string *)keyBuffer,false);
      std::__cxx11::string::~string((string *)keyBuffer);
      processEvent::wmProtocols = AVar12;
      __cxa_guard_release(&processEvent(_XEvent&)::wmProtocols);
    }
    if ((windowEvent->xkey).root != processEvent::wmProtocols) {
      return true;
    }
    if ((processEvent(_XEvent&)::wmDeleteWindow == '\0') &&
       (iVar7 = __cxa_guard_acquire(&processEvent(_XEvent&)::wmDeleteWindow), iVar7 != 0)) {
      std::__cxx11::string::string((string *)keyBuffer,"WM_DELETE_WINDOW",(allocator *)&event);
      AVar12 = getAtom((string *)keyBuffer,false);
      std::__cxx11::string::~string((string *)keyBuffer);
      processEvent::wmDeleteWindow = AVar12;
      __cxa_guard_release(&processEvent(_XEvent&)::wmDeleteWindow);
    }
    if ((processEvent(_XEvent&)::netWmPing == '\0') &&
       (iVar7 = __cxa_guard_acquire(&processEvent(_XEvent&)::netWmPing), iVar7 != 0)) {
      bVar5 = anon_unknown.dwarf_2f4052::WindowsImplX11Impl::ewmhSupported();
      if (bVar5) {
        std::__cxx11::string::string((string *)keyBuffer,"_NET_WM_PING",(allocator *)&event);
        AVar12 = getAtom((string *)keyBuffer,true);
        std::__cxx11::string::~string((string *)keyBuffer);
      }
      else {
        AVar12 = 0;
      }
      processEvent::netWmPing = AVar12;
      __cxa_guard_release(&processEvent(_XEvent&)::netWmPing);
    }
    if (((windowEvent->xexpose).width != 0x20) ||
       ((windowEvent->xkey).time != processEvent::wmDeleteWindow)) {
      if (((windowEvent->xkey).time != processEvent::netWmPing ||
          (windowEvent->xexpose).width != 0x20) || processEvent::netWmPing == 0) {
        return true;
      }
      (windowEvent->xany).window =
           *(Window *)
            (*(long *)(this->m_display + 0xe8) + 0x10 +
            (long)*(int *)(this->m_display + 0xe0) * 0x80);
      pDVar3 = this->m_display;
      XSendEvent(pDVar3,*(undefined8 *)
                         (*(long *)(pDVar3 + 0xe8) + 0x10 + (long)*(int *)(pDVar3 + 0xe0) * 0x80),0,
                 0x180000,windowEvent);
      return true;
    }
    keyBuffer[0] = '\0';
    keyBuffer[1] = '\0';
    keyBuffer[2] = '\0';
    keyBuffer[3] = '\0';
LAB_001c4f86:
    WindowImpl::pushEvent(&this->super_WindowImpl,(Event *)keyBuffer);
    break;
  case 0x22:
    if ((windowEvent->xfocus).mode == 1) {
      XRefreshKeyboardMapping(windowEvent);
    }
  }
  return true;
}

Assistant:

bool WindowImplX11::processEvent(XEvent& windowEvent)
{
    using namespace WindowsImplX11Impl;

    // Convert the X11 event to a sf::Event
    switch (windowEvent.type)
    {
        // Destroy event
        case DestroyNotify:
        {
            // The window is about to be destroyed: we must cleanup resources
            cleanup();
            break;
        }

        // Gain focus event
        case FocusIn:
        {
            // Update the input context
            if (m_inputContext)
                XSetICFocus(m_inputContext);

            // Grab cursor
            if (m_cursorGrabbed)
            {
                // Try multiple times to grab the cursor
                for (unsigned int trial = 0; trial < maxTrialsCount; ++trial)
                {
                    int result = XGrabPointer(m_display, m_window, True, None, GrabModeAsync, GrabModeAsync, m_window, None, CurrentTime);

                    if (result == GrabSuccess)
                    {
                        m_cursorGrabbed = true;
                        break;
                    }

                    // The cursor grab failed, trying again after a small sleep
                    sf::sleep(sf::milliseconds(50));
                }

                if (!m_cursorGrabbed)
                    err() << "Failed to grab mouse cursor" << std::endl;
            }

            Event event;
            event.type = Event::GainedFocus;
            pushEvent(event);

            // If the window has been previously marked urgent (notification) as a result of a focus request, undo that
            XWMHints* hints = XGetWMHints(m_display, m_window);
            if (hints != NULL)
            {
                // Remove urgency (notification) flag from hints
                hints->flags &= ~XUrgencyHint;
                XSetWMHints(m_display, m_window, hints);
                XFree(hints);
            }

            break;
        }

        // Lost focus event
        case FocusOut:
        {
            // Update the input context
            if (m_inputContext)
                XUnsetICFocus(m_inputContext);

            // Release cursor
            if (m_cursorGrabbed)
                XUngrabPointer(m_display, CurrentTime);

            Event event;
            event.type = Event::LostFocus;
            pushEvent(event);
            break;
        }

        // Resize event
        case ConfigureNotify:
        {
            // ConfigureNotify can be triggered for other reasons, check if the size has actually changed
            if ((windowEvent.xconfigure.width != m_previousSize.x) || (windowEvent.xconfigure.height != m_previousSize.y))
            {
                Event event;
                event.type        = Event::Resized;
                event.size.width  = static_cast<unsigned int>(windowEvent.xconfigure.width);
                event.size.height = static_cast<unsigned int>(windowEvent.xconfigure.height);
                pushEvent(event);

                m_previousSize.x = windowEvent.xconfigure.width;
                m_previousSize.y = windowEvent.xconfigure.height;
            }
            break;
        }

        // Close event
        case ClientMessage:
        {
            // Input methods might want random ClientMessage events
            if (!XFilterEvent(&windowEvent, None))
            {
                static Atom wmProtocols = getAtom("WM_PROTOCOLS");

                // Handle window manager protocol messages we support
                if (windowEvent.xclient.message_type == wmProtocols)
                {
                    static Atom wmDeleteWindow = getAtom("WM_DELETE_WINDOW");
                    static Atom netWmPing = ewmhSupported() ? getAtom("_NET_WM_PING", true) : None;

                    if ((windowEvent.xclient.format == 32) && (windowEvent.xclient.data.l[0]) == static_cast<long>(wmDeleteWindow))
                    {
                        // Handle the WM_DELETE_WINDOW message
                        Event event;
                        event.type = Event::Closed;
                        pushEvent(event);
                    }
                    else if (netWmPing && (windowEvent.xclient.format == 32) && (windowEvent.xclient.data.l[0]) == static_cast<long>(netWmPing))
                    {
                        // Handle the _NET_WM_PING message, send pong back to WM to show that we are responsive
                        windowEvent.xclient.window = DefaultRootWindow(m_display);

                        XSendEvent(m_display, DefaultRootWindow(m_display), False, SubstructureNotifyMask | SubstructureRedirectMask, &windowEvent);
                    }
                }
            }
            break;
        }

        // Key down event
        case KeyPress:
        {
            // Fill the event parameters
            // TODO: if modifiers are wrong, use XGetModifierMapping to retrieve the actual modifiers mapping
            Event event;
            event.type         = Event::KeyPressed;
            event.key.code     = KeyboardImpl::getKeyFromEvent(windowEvent.xkey);
            event.key.scancode = KeyboardImpl::getScancodeFromEvent(windowEvent.xkey);
            event.key.alt      = windowEvent.xkey.state & Mod1Mask;
            event.key.control  = windowEvent.xkey.state & ControlMask;
            event.key.shift    = windowEvent.xkey.state & ShiftMask;
            event.key.system   = windowEvent.xkey.state & Mod4Mask;

            const bool filtered = XFilterEvent(&windowEvent, None);

            // Generate a KeyPressed event if needed
            if (filtered)
            {
                pushEvent(event);
                isKeyFiltered.set(windowEvent.xkey.keycode);
            }
            else
            {
                // Push a KeyPressed event if the key has never been filtered before
                // (a KeyPressed event would have already been pushed if it had been filtered).
                //
                // Some dummy IMs (like the built-in one you get by setting XMODIFIERS=@im=none)
                // never filter events away, and we have to take care of that.
                //
                // In addition, ignore text-only KeyPress events generated by IMs (with keycode set to 0).
                if (!isKeyFiltered.test(windowEvent.xkey.keycode) && windowEvent.xkey.keycode != 0)
                    pushEvent(event);
            }

            // Generate TextEntered events if needed
            if (!filtered)
            {
                #ifdef X_HAVE_UTF8_STRING
                if (m_inputContext)
                {
                    Status status;
                    Uint8  keyBuffer[64];

                    int length = Xutf8LookupString(
                        m_inputContext,
                        &windowEvent.xkey,
                        reinterpret_cast<char*>(keyBuffer),
                        sizeof(keyBuffer),
                        NULL,
                        &status
                    );

                    if (status == XBufferOverflow)
                        err() << "A TextEntered event has more than 64 bytes of UTF-8 input, and "
                                 "has been discarded\nThis means either you have typed a very long string "
                                 "(more than 20 chars), or your input method is broken in obscure ways." << std::endl;
                    else if (status == XLookupChars)
                    {
                        // There might be more than 1 characters in this event,
                        // so we must iterate it
                        Uint32 unicode = 0;
                        Uint8* iter = keyBuffer;
                        while (iter < keyBuffer + length)
                        {
                            iter = Utf8::decode(iter, keyBuffer + length, unicode, 0);
                            if (unicode != 0)
                            {
                                Event textEvent;
                                textEvent.type         = Event::TextEntered;
                                textEvent.text.unicode = unicode;
                                pushEvent(textEvent);
                            }
                        }
                    }
                }
                else
                #endif
                {
                    static XComposeStatus status;
                    char keyBuffer[16];
                    if (XLookupString(&windowEvent.xkey, keyBuffer, sizeof(keyBuffer), NULL, &status))
                    {
                        Event textEvent;
                        textEvent.type         = Event::TextEntered;
                        textEvent.text.unicode = static_cast<Uint32>(keyBuffer[0]);
                        pushEvent(textEvent);
                    }
                }
            }

            updateLastInputTime(windowEvent.xkey.time);

            break;
        }

        // Key up event
        case KeyRelease:
        {
            // Fill the event parameters
            Event event;
            event.type         = Event::KeyReleased;
            event.key.code     = KeyboardImpl::getKeyFromEvent(windowEvent.xkey);
            event.key.scancode = KeyboardImpl::getScancodeFromEvent(windowEvent.xkey);
            event.key.alt      = windowEvent.xkey.state & Mod1Mask;
            event.key.control  = windowEvent.xkey.state & ControlMask;
            event.key.shift    = windowEvent.xkey.state & ShiftMask;
            event.key.system   = windowEvent.xkey.state & Mod4Mask;
            pushEvent(event);

            break;
        }

        // Mouse button pressed
        case ButtonPress:
        {
            // Buttons 4 and 5 are the vertical wheel and 6 and 7 the horizontal wheel.
            unsigned int button = windowEvent.xbutton.button;
            if ((button == Button1) ||
                (button == Button2) ||
                (button == Button3) ||
                (button == 8) ||
                (button == 9))
            {
                Event event;
                event.type          = Event::MouseButtonPressed;
                event.mouseButton.x = windowEvent.xbutton.x;
                event.mouseButton.y = windowEvent.xbutton.y;
                switch(button)
                {
                    case Button1: event.mouseButton.button = Mouse::Left;     break;
                    case Button2: event.mouseButton.button = Mouse::Middle;   break;
                    case Button3: event.mouseButton.button = Mouse::Right;    break;
                    case 8:       event.mouseButton.button = Mouse::XButton1; break;
                    case 9:       event.mouseButton.button = Mouse::XButton2; break;
                }
                pushEvent(event);
            }

            updateLastInputTime(windowEvent.xbutton.time);

            break;
        }

        // Mouse button released
        case ButtonRelease:
        {
            unsigned int button = windowEvent.xbutton.button;
            if ((button == Button1) ||
                (button == Button2) ||
                (button == Button3) ||
                (button == 8) ||
                (button == 9))
            {
                Event event;
                event.type          = Event::MouseButtonReleased;
                event.mouseButton.x = windowEvent.xbutton.x;
                event.mouseButton.y = windowEvent.xbutton.y;
                switch(button)
                {
                    case Button1: event.mouseButton.button = Mouse::Left;     break;
                    case Button2: event.mouseButton.button = Mouse::Middle;   break;
                    case Button3: event.mouseButton.button = Mouse::Right;    break;
                    case 8:       event.mouseButton.button = Mouse::XButton1; break;
                    case 9:       event.mouseButton.button = Mouse::XButton2; break;
                }
                pushEvent(event);
            }
            else if ((button == Button4) || (button == Button5))
            {
                Event event;

                event.type             = Event::MouseWheelMoved;
                event.mouseWheel.delta = (button == Button4) ? 1 : -1;
                event.mouseWheel.x     = windowEvent.xbutton.x;
                event.mouseWheel.y     = windowEvent.xbutton.y;
                pushEvent(event);

                event.type                   = Event::MouseWheelScrolled;
                event.mouseWheelScroll.wheel = Mouse::VerticalWheel;
                event.mouseWheelScroll.delta = (button == Button4) ? 1 : -1;
                event.mouseWheelScroll.x     = windowEvent.xbutton.x;
                event.mouseWheelScroll.y     = windowEvent.xbutton.y;
                pushEvent(event);
            }
            else if ((button == 6) || (button == 7))
            {
                Event event;
                event.type                   = Event::MouseWheelScrolled;
                event.mouseWheelScroll.wheel = Mouse::HorizontalWheel;
                event.mouseWheelScroll.delta = (button == 6) ? 1 : -1;
                event.mouseWheelScroll.x     = windowEvent.xbutton.x;
                event.mouseWheelScroll.y     = windowEvent.xbutton.y;
                pushEvent(event);
            }
            break;
        }

        // Mouse moved
        case MotionNotify:
        {
            Event event;
            event.type        = Event::MouseMoved;
            event.mouseMove.x = windowEvent.xmotion.x;
            event.mouseMove.y = windowEvent.xmotion.y;
            pushEvent(event);
            break;
        }

        // Mouse entered
        case EnterNotify:
        {
            if (windowEvent.xcrossing.mode == NotifyNormal)
            {
                Event event;
                event.type = Event::MouseEntered;
                pushEvent(event);
            }
            break;
        }

        // Mouse left
        case LeaveNotify:
        {
            if (windowEvent.xcrossing.mode == NotifyNormal)
            {
                Event event;
                event.type = Event::MouseLeft;
                pushEvent(event);
            }
            break;
        }

        // Keyboard mapping changed
        case MappingNotify:
        {
            if (windowEvent.xmapping.request == MappingKeyboard)
                XRefreshKeyboardMapping(&windowEvent.xmapping);

            break;
        }

        // Window unmapped
        case UnmapNotify:
        {
            if (windowEvent.xunmap.window == m_window)
                m_windowMapped = false;

            break;
        }

        // Window visibility change
        case VisibilityNotify:
        {
            // We prefer using VisibilityNotify over MapNotify because
            // some window managers like awesome don't internally flag a
            // window as viewable even after it is mapped but before it
            // is visible leading to certain function calls failing with
            // an unviewable error if called before VisibilityNotify arrives

            // Empirical testing on most widely used window managers shows
            // that mapping a window will always lead to a VisibilityNotify
            // event that is not VisibilityFullyObscured
            if (windowEvent.xvisibility.window == m_window)
            {
                if (windowEvent.xvisibility.state != VisibilityFullyObscured)
                    m_windowMapped = true;
            }

            break;
        }

        // Window property change
        case PropertyNotify:
        {
            if (!m_lastInputTime)
                m_lastInputTime = windowEvent.xproperty.time;

            break;
        }
    }

    return true;
}